

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsFactoryImpl.cpp
# Opt level: O0

unique_ptr<jaegertracing::metrics::Timer,_std::default_delete<jaegertracing::metrics::Timer>_>
__thiscall
jaegertracing::metrics::StatsFactoryImpl::createTimer
          (StatsFactoryImpl *this,string *name,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *tags)

{
  TimerImpl *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RCX;
  Timer *local_60;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *tags_local;
  string *name_local;
  StatsFactoryImpl *this_local;
  
  this_00 = (TimerImpl *)operator_new(0x70);
  anon_unknown_6::TimerImpl::TimerImpl
            (this_00,(StatsReporter *)name->_M_string_length,(string *)tags,in_RCX);
  local_60 = (Timer *)0x0;
  if (this_00 != (TimerImpl *)0x0) {
    local_60 = &this_00->super_Timer;
  }
  std::unique_ptr<jaegertracing::metrics::Timer,std::default_delete<jaegertracing::metrics::Timer>>
  ::unique_ptr<std::default_delete<jaegertracing::metrics::Timer>,void>
            ((unique_ptr<jaegertracing::metrics::Timer,std::default_delete<jaegertracing::metrics::Timer>>
              *)this,local_60);
  return (__uniq_ptr_data<jaegertracing::metrics::Timer,_std::default_delete<jaegertracing::metrics::Timer>,_true,_true>
          )(__uniq_ptr_data<jaegertracing::metrics::Timer,_std::default_delete<jaegertracing::metrics::Timer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Timer> StatsFactoryImpl::createTimer(
    const std::string& name,
    const std::unordered_map<std::string, std::string>& tags)
{
    return std::unique_ptr<Timer>(new TimerImpl(_reporter, name, tags));
}